

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

Room * newRoomFactory(itemLocation location,ItemTable *pTable)

{
  Room *pRVar1;
  allocator local_281;
  string local_280 [38];
  undefined1 local_25a;
  allocator local_259;
  string local_258 [38];
  undefined1 local_232;
  allocator local_231;
  string local_230 [38];
  undefined1 local_20a;
  allocator local_209;
  string local_208 [38];
  undefined1 local_1e2;
  allocator local_1e1;
  string local_1e0 [38];
  undefined1 local_1ba;
  allocator local_1b9;
  string local_1b8 [38];
  undefined1 local_192;
  allocator local_191;
  string local_190 [38];
  undefined1 local_16a;
  allocator local_169;
  string local_168 [38];
  undefined1 local_142;
  allocator local_141;
  string local_140 [38];
  undefined1 local_11a;
  allocator local_119;
  string local_118 [38];
  undefined1 local_f2;
  allocator local_f1;
  string local_f0 [38];
  undefined1 local_ca;
  allocator local_c9;
  string local_c8 [38];
  undefined1 local_a2;
  allocator local_a1;
  string local_a0 [38];
  undefined1 local_7a;
  allocator local_79;
  string local_78 [35];
  undefined1 local_55;
  allocator local_41;
  string local_40 [32];
  ItemTable *local_20;
  ItemTable *pTable_local;
  Room *pRStack_10;
  itemLocation location_local;
  
  local_20 = pTable;
  pTable_local._4_4_ = location;
  switch(location) {
  case THREE_KEY_ROOM:
    pRVar1 = (Room *)operator_new(0x138);
    local_f2 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f0,"keyroom",&local_f1);
    ThreeKeyRoom::ThreeKeyRoom((ThreeKeyRoom *)pRVar1,(string *)local_f0,local_20,true);
    local_f2 = 0;
    pRStack_10 = pRVar1;
    std::__cxx11::string::~string(local_f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_f1);
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/originalname51[P]adventure_game/main.cpp"
                  ,0xeb,"Room *newRoomFactory(itemLocation, ItemTable *)");
  case G_ROOM1_SIDE1:
  case G_ROOM1_SIDE2:
    pRVar1 = (Room *)operator_new(0x138);
    local_55 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"greenRoomOne",&local_41);
    GreenRoomOne::GreenRoomOne((GreenRoomOne *)pRVar1,(string *)local_40,local_20,true);
    local_55 = 0;
    pRStack_10 = pRVar1;
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    break;
  case G_ROOM2_BUCKET:
    pRVar1 = (Room *)operator_new(0x138);
    local_7a = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"greenRoomTwo",&local_79);
    GreenRoomTwo::GreenRoomTwo((GreenRoomTwo *)pRVar1,(string *)local_78,local_20,true);
    local_7a = 0;
    pRStack_10 = pRVar1;
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    break;
  case G_ROOM3_BASIN:
    pRVar1 = (Room *)operator_new(0x138);
    local_a2 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a0,"greenRoomThree",&local_a1);
    GreenRoomThree::GreenRoomThree((GreenRoomThree *)pRVar1,(string *)local_a0,local_20,true);
    local_a2 = 0;
    pRStack_10 = pRVar1;
    std::__cxx11::string::~string(local_a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
    break;
  case G_ROOM4_KID:
    pRVar1 = (Room *)operator_new(0x138);
    local_ca = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c8,"greenRoomFour",&local_c9);
    GreenRoomFour::GreenRoomFour((GreenRoomFour *)pRVar1,(string *)local_c8,local_20,true);
    local_ca = 0;
    pRStack_10 = pRVar1;
    std::__cxx11::string::~string(local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    break;
  case W_ROOM1:
    pRVar1 = (Room *)operator_new(0x138);
    local_11a = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_118,"whiteRoomOne",&local_119);
    WhiteRoomOne::WhiteRoomOne((WhiteRoomOne *)pRVar1,(string *)local_118,local_20,true);
    local_11a = 0;
    pRStack_10 = pRVar1;
    std::__cxx11::string::~string(local_118);
    std::allocator<char>::~allocator((allocator<char> *)&local_119);
    break;
  case W_ROOM2:
    pRVar1 = (Room *)operator_new(0x138);
    local_142 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_140,"whiteRoomTwo",&local_141);
    WhiteRoomTwo::WhiteRoomTwo((WhiteRoomTwo *)pRVar1,(string *)local_140,local_20,true);
    local_142 = 0;
    pRStack_10 = pRVar1;
    std::__cxx11::string::~string(local_140);
    std::allocator<char>::~allocator((allocator<char> *)&local_141);
    break;
  case W_ROOM3:
    pRVar1 = (Room *)operator_new(0x138);
    local_16a = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_168,"whiteRoomThree",&local_169);
    WhiteRoomThree::WhiteRoomThree((WhiteRoomThree *)pRVar1,(string *)local_168,local_20,true);
    local_16a = 0;
    pRStack_10 = pRVar1;
    std::__cxx11::string::~string(local_168);
    std::allocator<char>::~allocator((allocator<char> *)&local_169);
    break;
  case W_ROOM4:
    pRVar1 = (Room *)operator_new(0x138);
    local_192 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_190,"whiteRoomFour",&local_191);
    WhiteRoomFour::WhiteRoomFour((WhiteRoomFour *)pRVar1,(string *)local_190,local_20,true);
    local_192 = 0;
    pRStack_10 = pRVar1;
    std::__cxx11::string::~string(local_190);
    std::allocator<char>::~allocator((allocator<char> *)&local_191);
    break;
  case W_ROOM5:
    pRVar1 = (Room *)operator_new(0x138);
    local_1ba = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1b8,"whiteRoomFinal",&local_1b9);
    WhiteRoomFive::WhiteRoomFive((WhiteRoomFive *)pRVar1,(string *)local_1b8,local_20,true);
    local_1ba = 0;
    pRStack_10 = pRVar1;
    std::__cxx11::string::~string(local_1b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
    break;
  case B_ROOM1:
    pRVar1 = (Room *)operator_new(0x138);
    local_1e2 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1e0,"blueRoomOne",&local_1e1);
    BlueRoomOne::BlueRoomOne((BlueRoomOne *)pRVar1,(string *)local_1e0,local_20,true);
    local_1e2 = 0;
    pRStack_10 = pRVar1;
    std::__cxx11::string::~string(local_1e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
    break;
  case B_ROOM2:
    pRVar1 = (Room *)operator_new(0x138);
    local_20a = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_208,"blueRoomTwo",&local_209);
    BlueRoomTwo::BlueRoomTwo((BlueRoomTwo *)pRVar1,(string *)local_208,local_20,true);
    local_20a = 0;
    pRStack_10 = pRVar1;
    std::__cxx11::string::~string(local_208);
    std::allocator<char>::~allocator((allocator<char> *)&local_209);
    break;
  case B_ROOM3:
    pRVar1 = (Room *)operator_new(0x138);
    local_232 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_230,"blueRoomThree",&local_231);
    BlueRoomThree::BlueRoomThree((BlueRoomThree *)pRVar1,(string *)local_230,local_20,true);
    local_232 = 0;
    pRStack_10 = pRVar1;
    std::__cxx11::string::~string(local_230);
    std::allocator<char>::~allocator((allocator<char> *)&local_231);
    break;
  case B_ROOM4:
    pRVar1 = (Room *)operator_new(0x138);
    local_25a = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_258,"blueRoomFour",&local_259);
    BlueRoomFour::BlueRoomFour((BlueRoomFour *)pRVar1,(string *)local_258,local_20,true);
    local_25a = 0;
    pRStack_10 = pRVar1;
    std::__cxx11::string::~string(local_258);
    std::allocator<char>::~allocator((allocator<char> *)&local_259);
    break;
  case B_ROOM5:
    pRVar1 = (Room *)operator_new(0x138);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_280,"blueRoomFinal",&local_281);
    BlueRoomFive::BlueRoomFive((BlueRoomFive *)pRVar1,(string *)local_280,local_20,true);
    pRStack_10 = pRVar1;
    std::__cxx11::string::~string(local_280);
    std::allocator<char>::~allocator((allocator<char> *)&local_281);
  }
  return pRStack_10;
}

Assistant:

Room *newRoomFactory(itemLocation location, ItemTable *pTable) {
    switch(location) {
        case G_ROOM1_SIDE1:
        case G_ROOM1_SIDE2:
            return new GreenRoomOne("greenRoomOne", pTable, true);
        case G_ROOM2_BUCKET :
            return new GreenRoomTwo("greenRoomTwo", pTable, true);
        case G_ROOM3_BASIN :
            return new GreenRoomThree("greenRoomThree", pTable, true);
        case G_ROOM4_KID :
            return new GreenRoomFour("greenRoomFour", pTable, true);
        case THREE_KEY_ROOM :
            return new ThreeKeyRoom("keyroom",pTable, true);
        case W_ROOM1 :
            return new WhiteRoomOne("whiteRoomOne", pTable, true);
        case W_ROOM2 :
            return new WhiteRoomTwo("whiteRoomTwo", pTable, true);
        case W_ROOM3 :
            return new WhiteRoomThree("whiteRoomThree", pTable, true);
        case W_ROOM4 :
            return new WhiteRoomFour("whiteRoomFour", pTable, true);
        case W_ROOM5 :
            return new WhiteRoomFive("whiteRoomFinal", pTable, true);
        case B_ROOM1 :
            return new BlueRoomOne("blueRoomOne", pTable, true);
        case B_ROOM2 :
            return new BlueRoomTwo("blueRoomTwo", pTable, true);
        case B_ROOM3 :
            return new BlueRoomThree("blueRoomThree", pTable, true);
        case B_ROOM4 :
            return new BlueRoomFour("blueRoomFour", pTable, true);
        case B_ROOM5 :
            return new BlueRoomFive("blueRoomFinal", pTable, true);
        default:
            assert(false);
            break;
    }
}